

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::set_ssl_cert_buffer
          (torrent *this,string *certificate,string *private_key,string *dh_params)

{
  int *piVar1;
  context *pcVar2;
  pointer buf;
  _Atomic_word *p_Var3;
  size_type sVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  tuple<libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_> bp;
  long lVar6;
  ulong uVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  system_error_category *psVar8;
  char cVar9;
  const_buffer private_key_buf;
  const_buffer certificate_buf;
  error_code local_78;
  undefined1 local_68 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_48;
  const_buffer local_40;
  
  pcVar2 = (this->m_ssl_ctx)._M_t.
           super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
           ._M_t.
           super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
           .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
  if (pcVar2 == (context *)0x0) {
    return;
  }
  local_40.data_ = (certificate->_M_dataplus)._M_p;
  local_40.size_ = certificate->_M_string_length;
  local_78.val_ = 0;
  local_78.failed_ = false;
  psVar8 = &boost::system::detail::cat_holder<void>::system_category_instance;
  local_78.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::ssl::context::use_certificate(pcVar2,&local_40,pem,&local_78);
  if ((local_78.failed_ == true) &&
     (iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])(),
     (*(uint *)(CONCAT44(extraout_var,iVar5) + 0x68) & 0x41) != 0)) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)(local_68 + 0x18));
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[14]>
              ((alert_manager *)CONCAT44(extraout_var_00,iVar5),(torrent_handle *)(local_68 + 0x18),
               &local_78,(char (*) [14])"[certificate]");
    if (_Stack_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var3 = &(_Stack_48._M_pi)->_M_weak_count;
        iVar5 = *p_Var3;
        *p_Var3 = *p_Var3 + -1;
        UNLOCK();
      }
      else {
        iVar5 = (_Stack_48._M_pi)->_M_weak_count;
        (_Stack_48._M_pi)->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(_Stack_48._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
  }
  local_68._24_8_ = (private_key->_M_dataplus)._M_p;
  _Stack_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)private_key->_M_string_length;
  boost::asio::ssl::context::use_private_key
            ((this->m_ssl_ctx)._M_t.
             super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
             ._M_t.
             super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
             .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl,
             (const_buffer *)(local_68 + 0x18),pem,&local_78);
  if ((local_78.failed_ == true) &&
     (iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])(),
     (*(uint *)(CONCAT44(extraout_var_01,iVar5) + 0x68) & 0x41) != 0)) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_68);
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[14]>
              ((alert_manager *)CONCAT44(extraout_var_02,iVar5),(torrent_handle *)local_68,&local_78
               ,(char (*) [14])"[private key]");
    if ((piece_picker *)local_68._8_8_ != (piece_picker *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ).
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(code *)(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  buf = (dh_params->_M_dataplus)._M_p;
  sVar4 = dh_params->_M_string_length;
  pcVar2 = (this->m_ssl_ctx)._M_t.
           super___uniq_ptr_impl<boost::asio::ssl::context,_std::default_delete<boost::asio::ssl::context>_>
           ._M_t.
           super__Tuple_impl<0UL,_boost::asio::ssl::context_*,_std::default_delete<boost::asio::ssl::context>_>
           .super__Head_base<0UL,_boost::asio::ssl::context_*,_false>._M_head_impl;
  ERR_clear_error();
  bp.
  super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
  .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
        )BIO_new_mem_buf(buf,(int)sVar4);
  local_68._16_8_ =
       bp.
       super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
       .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
  if (bp.
      super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
      .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl ==
      (_Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>)0x0) {
    uVar7 = ERR_get_error();
    if ((DAT_004fcf68 == -0x4d54ee85da8120f3) || (DAT_004fcf68 == -0x70502de1da3a1f65)) {
      local_78.failed_ = (int)uVar7 != 0;
    }
    else {
      local_78.failed_ =
           (bool)(**(code **)(boost::asio::error::get_ssl_category()::instance + 0x30))
                           (&boost::asio::error::get_ssl_category()::instance,uVar7 & 0xffffffff);
    }
    local_78.cat_ = (error_category *)&boost::asio::error::get_ssl_category()::instance;
    local_78.val_ = (int)uVar7;
    goto LAB_0032b394;
  }
  ERR_clear_error();
  local_68._0_8_ =
       PEM_read_bio_DHparams
                 ((BIO *)bp.
                         super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl,
                  (DH **)0x0,(undefined1 *)0x0,(void *)0x0);
  if ((DH *)local_68._0_8_ == (DH *)0x0) {
LAB_0032b2e4:
    uVar7 = ERR_get_error();
    iVar5 = (int)uVar7;
    psVar8 = (system_error_category *)&boost::asio::error::get_ssl_category()::instance;
    if ((DAT_004fcf68 == -0x4d54ee85da8120f3) || (DAT_004fcf68 == -0x70502de1da3a1f65)) {
      cVar9 = iVar5 != 0;
    }
    else {
      cVar9 = (**(code **)(boost::asio::error::get_ssl_category()::instance + 0x30))
                        (&boost::asio::error::get_ssl_category()::instance,uVar7 & 0xffffffff);
    }
  }
  else {
    iVar5 = 0;
    lVar6 = SSL_CTX_ctrl((SSL_CTX *)pcVar2->handle_,3,0,(void *)local_68._0_8_);
    cVar9 = '\0';
    if (lVar6 != 1) goto LAB_0032b2e4;
  }
  local_78.val_ = iVar5;
  local_78.failed_ = (bool)cVar9;
  local_78.cat_ = &psVar8->super_error_category;
  boost::asio::ssl::context::dh_cleanup::~dh_cleanup((dh_cleanup *)local_68);
LAB_0032b394:
  boost::asio::ssl::context::bio_cleanup::~bio_cleanup((bio_cleanup *)(local_68 + 0x10));
  if ((local_78.failed_ == true) &&
     (iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])(),
     (*(uint *)(CONCAT44(extraout_var_03,iVar5) + 0x68) & 0x41) != 0)) {
    iVar5 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_68);
    alert_manager::
    emplace_alert<libtorrent::torrent_error_alert,libtorrent::torrent_handle,boost::system::error_code&,char_const(&)[12]>
              ((alert_manager *)CONCAT44(extraout_var_04,iVar5),(torrent_handle *)local_68,&local_78
               ,(char (*) [12])"[dh params]");
    if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_68._8_8_ !=
        (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        iVar5 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4);
        *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ).
                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*(code *)(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  return;
}

Assistant:

void torrent::set_ssl_cert_buffer(std::string const& certificate
		, std::string const& private_key
		, std::string const& dh_params)
	{
		if (!m_ssl_ctx) return;

		boost::asio::const_buffer certificate_buf(certificate.c_str(), certificate.size());

		error_code ec;
		m_ssl_ctx->use_certificate(certificate_buf, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "[certificate]");
		}

		boost::asio::const_buffer private_key_buf(private_key.c_str(), private_key.size());
		m_ssl_ctx->use_private_key(private_key_buf, ssl::context::pem, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "[private key]");
		}

		boost::asio::const_buffer dh_params_buf(dh_params.c_str(), dh_params.size());
		m_ssl_ctx->use_tmp_dh(dh_params_buf, ec);
		if (ec)
		{
			if (alerts().should_post<torrent_error_alert>())
				alerts().emplace_alert<torrent_error_alert>(get_handle(), ec, "[dh params]");
		}
	}